

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkillTree.cpp
# Opt level: O1

void __thiscall
SkillTree::SkillTreeNode::SkillTreeNode
          (SkillTreeNode *this,string *title,string *flavourText,string *graphicPath,vf2d *pos,
          uint64_t cost)

{
  pointer pcVar1;
  
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  pcVar1 = (title->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + title->_M_string_length);
  (this->flavour)._M_dataplus._M_p = (pointer)&(this->flavour).field_2;
  pcVar1 = (flavourText->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->flavour,pcVar1,pcVar1 + flavourText->_M_string_length);
  (this->graphic)._vptr_Renderable = (_func_int **)&PTR__Renderable_0019f720;
  (this->graphic).pSprite._M_t.super___uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>
  ._M_t.super__Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>.
  super__Head_base<0UL,_olc::Sprite_*,_false>._M_head_impl = (Sprite *)0x0;
  (this->graphic).pDecal._M_t.super___uniq_ptr_impl<olc::Decal,_std::default_delete<olc::Decal>_>.
  _M_t.super__Tuple_impl<0UL,_olc::Decal_*,_std::default_delete<olc::Decal>_>.
  super__Head_base<0UL,_olc::Decal_*,_false>._M_head_impl = (Decal *)0x0;
  (this->deps).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deps).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deps).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pos).x = pos->x;
  (this->pos).y = pos->y;
  this->completed = false;
  this->cost = cost;
  olc::Renderable::Load(&this->graphic,graphicPath,(ResourcePack *)0x0);
  return;
}

Assistant:

SkillTree::SkillTreeNode::SkillTreeNode(std::string title,
	std::string flavourText,
	std::string graphicPath,
	olc::vf2d pos,
	std::uint64_t cost)
    : title{title}, flavour{flavourText}, pos{pos}, cost{cost}
{
    graphic.Load(graphicPath);
}